

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<long,long,long,duckdb::ExclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *asel;
  long *adata_00;
  SelectionVector *bsel;
  long *bdata_00;
  SelectionVector *csel;
  long *cdata_00;
  ValidityMask *avalidity;
  idx_t iVar1;
  ValidityMask *bvalidity;
  ValidityMask *cvalidity;
  
  asel = adata->sel;
  adata_00 = (long *)adata->data;
  bsel = bdata->sel;
  bdata_00 = (long *)bdata->data;
  csel = cdata->sel;
  cdata_00 = (long *)cdata->data;
  avalidity = &adata->validity;
  bvalidity = &bdata->validity;
  cvalidity = &cdata->validity;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar1 = SelectLoop<long,long,long,duckdb::ExclusiveBetweenOperator,false,false,true>
                        (adata_00,bdata_00,cdata_00,sel,count,asel,bsel,csel,avalidity,bvalidity,
                         cvalidity,(SelectionVector *)0x0,false_sel);
    }
    else {
      iVar1 = SelectLoop<long,long,long,duckdb::ExclusiveBetweenOperator,false,true,false>
                        (adata_00,bdata_00,cdata_00,sel,count,asel,bsel,csel,avalidity,bvalidity,
                         cvalidity,true_sel,false_sel);
    }
  }
  else {
    iVar1 = SelectLoop<long,long,long,duckdb::ExclusiveBetweenOperator,false,true,true>
                      (adata_00,bdata_00,cdata_00,sel,count,asel,bsel,csel,avalidity,bvalidity,
                       cvalidity,true_sel,false_sel);
  }
  return iVar1;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}